

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyMeshT.cc
# Opt level: O2

void __thiscall
OpenMesh::
PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
::calc_vertex_normal_fast
          (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           *this,VertexHandle _vh,Normal *_n)

{
  value_type _fh;
  Normal *_rhs;
  undefined1 local_38 [8];
  ConstVertexFaceIter vf_it;
  
  (_n->super_VectorDataT<double,_3>).values_[0] = 0.0;
  (_n->super_VectorDataT<double,_3>).values_[1] = 0.0;
  (_n->super_VectorDataT<double,_3>).values_[2] = 0.0;
  PolyConnectivity::cvf_iter
            ((ConstVertexFaceIter *)local_38,(PolyConnectivity *)this,
             (VertexHandle)_vh.super_BaseHandle.idx_);
  while ((vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
         (((int)vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
           vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
          (vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
           idx_ == 0))))) {
    _fh = Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
          ::operator*((ConstVertexFaceIter *)local_38);
    _rhs = AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
           normal(&this->
                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  ,(FaceHandle)_fh.super_BaseHandle.idx_);
    VectorT<double,_3>::operator+=(_n,_rhs);
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
    ::operator++((ConstVertexFaceIter *)local_38);
  }
  return;
}

Assistant:

void PolyMeshT<Kernel>::
calc_vertex_normal_fast(VertexHandle _vh, Normal& _n) const
{
  _n.vectorize(0.0);
  for (ConstVertexFaceIter vf_it = this->cvf_iter(_vh); vf_it.is_valid(); ++vf_it)
    _n += this->normal(*vf_it);
}